

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_interfaces.cpp
# Opt level: O0

spv_result_t
spvtools::val::anon_unknown_0::NumConsumedLocations
          (ValidationState_t *_,Instruction *type,uint32_t *num_locations)

{
  Instruction *pIVar1;
  bool bVar2;
  Op OVar3;
  uint32_t uVar4;
  uint uVar5;
  spv_result_t sVar6;
  AddressingModel AVar7;
  StorageClass SVar8;
  ulong uVar9;
  vector<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_> *this;
  size_type sVar10;
  Instruction *pIVar11;
  DiagnosticStream *pDVar12;
  DiagnosticStream local_430;
  undefined4 local_254;
  uint32_t local_250;
  spv_result_t error;
  uint32_t member_locations;
  uint32_t i;
  DiagnosticStream local_228;
  tuple<bool_&,_bool_&,_unsigned_int_&> local_50;
  tuple<bool,_bool,_unsigned_int> local_38;
  uint local_30;
  bool local_2a;
  bool local_29;
  uint32_t value;
  bool is_const;
  bool is_int;
  uint32_t *num_locations_local;
  Instruction *type_local;
  ValidationState_t *__local;
  
  *num_locations = 0;
  _value = num_locations;
  num_locations_local = (uint32_t *)type;
  type_local = (Instruction *)_;
  OVar3 = Instruction::opcode(type);
  pIVar1 = type_local;
  switch(OVar3) {
  case OpTypeInt:
  case OpTypeFloat:
    *_value = 1;
    break;
  case OpTypeVector:
    uVar4 = Instruction::id((Instruction *)num_locations_local);
    bVar2 = ValidationState_t::ContainsSizedIntOrFloatType
                      ((ValidationState_t *)pIVar1,uVar4,OpTypeInt,0x40);
    pIVar1 = type_local;
    if (bVar2) {
LAB_005776e7:
      uVar5 = Instruction::GetOperandAs<unsigned_int>((Instruction *)num_locations_local,2);
      if (2 < uVar5) {
        *_value = 2;
        return SPV_SUCCESS;
      }
    }
    else {
      uVar4 = Instruction::id((Instruction *)num_locations_local);
      bVar2 = ValidationState_t::ContainsSizedIntOrFloatType
                        ((ValidationState_t *)pIVar1,uVar4,OpTypeFloat,0x40);
      if (bVar2) goto LAB_005776e7;
    }
    *_value = 1;
    break;
  case OpTypeMatrix:
    uVar5 = Instruction::GetOperandAs<unsigned_int>((Instruction *)num_locations_local,1);
    pIVar11 = ValidationState_t::FindDef((ValidationState_t *)pIVar1,uVar5);
    NumConsumedLocations((ValidationState_t *)pIVar1,pIVar11,_value);
    uVar5 = Instruction::GetOperandAs<unsigned_int>((Instruction *)num_locations_local,2);
    *_value = uVar5 * *_value;
    break;
  default:
switchD_00577674_caseD_19:
    ValidationState_t::diag
              (&local_430,(ValidationState_t *)type_local,SPV_ERROR_INVALID_DATA,
               (Instruction *)num_locations_local);
    pDVar12 = DiagnosticStream::operator<<
                        (&local_430,(char (*) [34])"Invalid type to assign a location");
    __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar12);
    DiagnosticStream::~DiagnosticStream(&local_430);
    return __local._4_4_;
  case OpTypeArray:
    uVar5 = Instruction::GetOperandAs<unsigned_int>((Instruction *)num_locations_local,1);
    pIVar11 = ValidationState_t::FindDef((ValidationState_t *)pIVar1,uVar5);
    NumConsumedLocations((ValidationState_t *)pIVar1,pIVar11,_value);
    pIVar1 = type_local;
    local_29 = false;
    local_2a = false;
    local_30 = 0;
    uVar5 = Instruction::GetOperandAs<unsigned_int>((Instruction *)num_locations_local,2);
    ValidationState_t::EvalInt32IfConst(&local_38,(ValidationState_t *)pIVar1,uVar5);
    std::tie<bool,bool,unsigned_int>(&local_50,&local_29,&local_2a,&local_30);
    std::tuple<bool&,bool&,unsigned_int&>::operator=
              ((tuple<bool&,bool&,unsigned_int&> *)&local_50,&local_38);
    if (((local_29 & 1U) != 0) && ((local_2a & 1U) != 0)) {
      *_value = local_30 * *_value;
    }
    break;
  case OpTypeStruct:
    uVar4 = Instruction::id((Instruction *)num_locations_local);
    bVar2 = ValidationState_t::HasDecoration((ValidationState_t *)pIVar1,uVar4,Location);
    if (bVar2) {
      ValidationState_t::diag
                (&local_228,(ValidationState_t *)type_local,SPV_ERROR_INVALID_DATA,
                 (Instruction *)num_locations_local);
      ValidationState_t::VkErrorID_abi_cxx11_
                ((string *)&member_locations,(ValidationState_t *)type_local,0x1336,(char *)0x0);
      pDVar12 = DiagnosticStream::operator<<
                          (&local_228,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &member_locations);
      pDVar12 = DiagnosticStream::operator<<
                          (pDVar12,(char (*) [38])"Members cannot be assigned a location");
      __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar12);
      std::__cxx11::string::~string((string *)&member_locations);
      DiagnosticStream::~DiagnosticStream(&local_228);
      return __local._4_4_;
    }
    error = SPV_UNSUPPORTED;
    while( true ) {
      uVar9 = (ulong)(uint)error;
      this = Instruction::operands((Instruction *)num_locations_local);
      sVar10 = std::vector<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>::size(this);
      pIVar1 = type_local;
      if (sVar10 <= uVar9) break;
      local_250 = 0;
      uVar5 = Instruction::GetOperandAs<unsigned_int>
                        ((Instruction *)num_locations_local,(ulong)(uint)error);
      pIVar11 = ValidationState_t::FindDef((ValidationState_t *)pIVar1,uVar5);
      sVar6 = NumConsumedLocations((ValidationState_t *)pIVar1,pIVar11,&local_250);
      if (sVar6 != SPV_SUCCESS) {
        return sVar6;
      }
      *_value = local_250 + *_value;
      error = error + SPV_UNSUPPORTED;
      local_254 = 0;
    }
    break;
  case OpTypePointer:
    AVar7 = ValidationState_t::addressing_model((ValidationState_t *)type_local);
    if ((AVar7 != PhysicalStorageBuffer64) ||
       (SVar8 = Instruction::GetOperandAs<spv::StorageClass>((Instruction *)num_locations_local,1),
       SVar8 != PhysicalStorageBuffer)) goto switchD_00577674_caseD_19;
    *_value = 1;
  }
  return SPV_SUCCESS;
}

Assistant:

spv_result_t NumConsumedLocations(ValidationState_t& _, const Instruction* type,
                                  uint32_t* num_locations) {
  *num_locations = 0;
  switch (type->opcode()) {
    case spv::Op::OpTypeInt:
    case spv::Op::OpTypeFloat:
      // Scalars always consume a single location.
      *num_locations = 1;
      break;
    case spv::Op::OpTypeVector:
      // 3- and 4-component 64-bit vectors consume two locations.
      if ((_.ContainsSizedIntOrFloatType(type->id(), spv::Op::OpTypeInt, 64) ||
           _.ContainsSizedIntOrFloatType(type->id(), spv::Op::OpTypeFloat,
                                         64)) &&
          (type->GetOperandAs<uint32_t>(2) > 2)) {
        *num_locations = 2;
      } else {
        *num_locations = 1;
      }
      break;
    case spv::Op::OpTypeMatrix:
      // Matrices consume locations equal to the underlying vector type for
      // each column.
      NumConsumedLocations(_, _.FindDef(type->GetOperandAs<uint32_t>(1)),
                           num_locations);
      *num_locations *= type->GetOperandAs<uint32_t>(2);
      break;
    case spv::Op::OpTypeArray: {
      // Arrays consume locations equal to the underlying type times the number
      // of elements in the vector.
      NumConsumedLocations(_, _.FindDef(type->GetOperandAs<uint32_t>(1)),
                           num_locations);
      bool is_int = false;
      bool is_const = false;
      uint32_t value = 0;
      // Attempt to evaluate the number of array elements.
      std::tie(is_int, is_const, value) =
          _.EvalInt32IfConst(type->GetOperandAs<uint32_t>(2));
      if (is_int && is_const) *num_locations *= value;
      break;
    }
    case spv::Op::OpTypeStruct: {
      // Members cannot have location decorations at this point.
      if (_.HasDecoration(type->id(), spv::Decoration::Location)) {
        return _.diag(SPV_ERROR_INVALID_DATA, type)
               << _.VkErrorID(4918) << "Members cannot be assigned a location";
      }

      // Structs consume locations equal to the sum of the locations consumed
      // by the members.
      for (uint32_t i = 1; i < type->operands().size(); ++i) {
        uint32_t member_locations = 0;
        if (auto error = NumConsumedLocations(
                _, _.FindDef(type->GetOperandAs<uint32_t>(i)),
                &member_locations)) {
          return error;
        }
        *num_locations += member_locations;
      }
      break;
    }
    case spv::Op::OpTypePointer: {
      if (_.addressing_model() ==
              spv::AddressingModel::PhysicalStorageBuffer64 &&
          type->GetOperandAs<spv::StorageClass>(1) ==
              spv::StorageClass::PhysicalStorageBuffer) {
        *num_locations = 1;
        break;
      }
      [[fallthrough]];
    }
    default:
      return _.diag(SPV_ERROR_INVALID_DATA, type)
             << "Invalid type to assign a location";
  }

  return SPV_SUCCESS;
}